

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

void UpdateMeshReferences
               (aiNode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshMapping)

{
  const_reference pvVar1;
  uint local_28;
  uint i;
  uint ref;
  uint a;
  uint out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *meshMapping_local;
  aiNode *node_local;
  
  if (node->mNumMeshes != 0) {
    ref = 0;
    for (i = 0; i < node->mNumMeshes; i = i + 1) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (meshMapping,(ulong)node->mMeshes[i]);
      if (*pvVar1 != 0xffffffff) {
        node->mMeshes[ref] = *pvVar1;
        ref = ref + 1;
      }
    }
    node->mNumMeshes = ref;
    if (ref == 0) {
      if (node->mMeshes != (uint *)0x0) {
        operator_delete__(node->mMeshes);
      }
      node->mMeshes = (uint *)0x0;
    }
  }
  for (local_28 = 0; local_28 < node->mNumChildren; local_28 = local_28 + 1) {
    UpdateMeshReferences(node->mChildren[local_28],meshMapping);
  }
  return;
}

Assistant:

void UpdateMeshReferences(aiNode* node, const std::vector<unsigned int>& meshMapping) {
    if (node->mNumMeshes)   {
        unsigned int out = 0;
        for (unsigned int a = 0; a < node->mNumMeshes;++a)  {

            unsigned int ref = node->mMeshes[a];
            if (UINT_MAX != (ref = meshMapping[ref]))   {
                node->mMeshes[out++] = ref;
            }
        }
        // just let the members that are unused, that's much cheaper
        // than a full array realloc'n'copy party ...
        if(!(node->mNumMeshes = out))   {

            delete[] node->mMeshes;
            node->mMeshes = NULL;
        }
    }
    // recursively update all children
    for (unsigned int i = 0; i < node->mNumChildren;++i) {
        UpdateMeshReferences(node->mChildren[i],meshMapping);
    }
}